

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm.c
# Opt level: O0

void easm_del_insn(easm_insn *insn)

{
  int local_14;
  int i;
  easm_insn *insn_local;
  
  if (insn != (easm_insn *)0x0) {
    for (local_14 = 0; local_14 < insn->subinsnsnum; local_14 = local_14 + 1) {
      easm_del_subinsn(insn->subinsns[local_14]);
    }
    free(insn->subinsns);
    free(insn);
  }
  return;
}

Assistant:

void easm_del_insn(struct easm_insn *insn) {
	if (!insn) return;
	int i;
	for (i = 0; i < insn->subinsnsnum; i++)
		easm_del_subinsn(insn->subinsns[i]);
	free(insn->subinsns);
	free(insn);
}